

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int io_file_close(lua_State *L,IOFileUD *iof)

{
  long lVar1;
  int iVar2;
  undefined8 *in_RSI;
  char *in_RDI;
  lua_State *unaff_retaddr;
  int stat;
  int ok;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  if ((*(uint *)(in_RSI + 1) & 3) == 0) {
    fclose((FILE *)*in_RSI);
    *in_RSI = 0;
    iVar2 = luaL_fileresult(unaff_retaddr,in_stack_fffffffffffffffc,in_RDI);
  }
  else if ((*(uint *)(in_RSI + 1) & 3) == 1) {
    iVar2 = pclose((FILE *)*in_RSI);
    *in_RSI = 0;
    iVar2 = luaL_execresult((lua_State *)CONCAT44(in_stack_ffffffffffffffe4,iVar2),
                            in_stack_ffffffffffffffdc);
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x18);
    *(long *)(in_RDI + 0x18) = lVar1 + 8;
    *(undefined4 *)(lVar1 + 4) = 0xffffffff;
    lua_pushlstring((lua_State *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    in_RDI,(size_t)in_RSI);
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

static int io_file_close(lua_State *L, IOFileUD *iof)
{
  int ok;
  if ((iof->type & IOFILE_TYPE_MASK) == IOFILE_TYPE_FILE) {
    ok = (fclose(iof->fp) == 0);
  } else if ((iof->type & IOFILE_TYPE_MASK) == IOFILE_TYPE_PIPE) {
    int stat = -1;
#if LJ_TARGET_POSIX
    stat = pclose(iof->fp);
#elif LJ_TARGET_WINDOWS
    stat = _pclose(iof->fp);
#else
    lua_assert(0);
    return 0;
#endif
#if LJ_52
    iof->fp = NULL;
    return luaL_execresult(L, stat);
#else
    ok = (stat != -1);
#endif
  } else {
    lua_assert((iof->type & IOFILE_TYPE_MASK) == IOFILE_TYPE_STDF);
    setnilV(L->top++);
    lua_pushliteral(L, "cannot close standard file");
    return 2;
  }
  iof->fp = NULL;
  return luaL_fileresult(L, ok, NULL);
}